

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_crt_ext(uchar **p,uchar *end,mbedtls_x509_crt *crt)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  byte *end_00;
  byte *end_01;
  bool bVar4;
  int ext_type;
  int is_critical;
  size_t len;
  mbedtls_x509_buf extn_oid;
  uint local_90;
  int local_8c;
  mbedtls_x509_crt *local_88;
  size_t local_80;
  mbedtls_asn1_buf local_78;
  int *local_60;
  int *local_58;
  uint *local_50;
  mbedtls_asn1_sequence *local_48;
  mbedtls_x509_sequence *local_40;
  uchar *local_38;
  
  iVar1 = mbedtls_x509_get_ext(p,end,&crt->v3_ext,3);
  if (iVar1 == -0x62) {
    iVar1 = 0;
  }
  else if (iVar1 == 0) {
    puVar3 = *p;
    if (puVar3 < end) {
      local_38 = &crt->ns_cert_type;
      local_40 = &crt->subject_alt_names;
      local_48 = &crt->ext_key_usage;
      local_50 = &crt->key_usage;
      local_58 = &crt->ca_istrue;
      local_60 = &crt->max_pathlen;
      local_88 = crt;
      do {
        local_78.tag = 0;
        local_78._4_4_ = 0;
        local_78.len = 0;
        local_78.p = (uchar *)0x0;
        local_8c = 0;
        local_90 = 0;
        iVar1 = mbedtls_asn1_get_tag(p,end,&local_80,0x30);
        if (iVar1 != 0) {
          bVar4 = true;
          uVar2 = iVar1 - 0x2500;
          goto LAB_00125027;
        }
        end_01 = *p + local_80;
        local_78.tag = (uint)**p;
        iVar1 = mbedtls_asn1_get_tag(p,end,&local_78.len,6);
        if (iVar1 == 0) {
          local_78.p = *p;
          puVar3 = local_78.p + local_78.len;
          *p = puVar3;
          bVar4 = true;
          if (end == puVar3 || (long)end - (long)puVar3 < 0) {
            uVar2 = 0xffffdaa0;
            goto LAB_00125022;
          }
          iVar1 = mbedtls_asn1_get_bool(p,end_01,&local_8c);
          if (((iVar1 != -0x62) && (iVar1 != 0)) ||
             (iVar1 = mbedtls_asn1_get_tag(p,end_01,&local_80,4), iVar1 != 0)) {
            uVar2 = iVar1 - 0x2500;
            goto LAB_00125022;
          }
          end_00 = *p + local_80;
          uVar2 = 0xffffda9a;
          if (end_00 != end_01) goto LAB_00125022;
          iVar1 = mbedtls_oid_get_x509_ext_type(&local_78,(int *)&local_90);
          if (iVar1 == 0) {
            uVar2 = 0xffffdb00;
            if ((local_90 & local_88->ext_types) == 0) {
              local_88->ext_types = local_88->ext_types | local_90;
              uVar2 = 0xffffdf80;
              if ((int)local_90 < 0x100) {
                if (local_90 == 4) {
                  uVar2 = x509_get_key_usage(p,end_00,local_50);
                }
                else {
                  if (local_90 != 0x20) goto LAB_00125027;
                  uVar2 = x509_get_subject_alt_name(p,end_00,local_40);
                }
              }
              else if (local_90 == 0x10000) {
                uVar2 = x509_get_ns_cert_type(p,end_00,local_38);
              }
              else if (local_90 == 0x800) {
                iVar1 = mbedtls_asn1_get_sequence_of(p,end_00,local_48,6);
                if (iVar1 == 0) {
                  uVar2 = 0;
                  if ((local_88->ext_key_usage).buf.p == (uchar *)0x0) {
                    uVar2 = 0xffffda9c;
                  }
                }
                else {
                  uVar2 = iVar1 - 0x2500;
                }
              }
              else {
                if (local_90 != 0x100) goto LAB_00125027;
                uVar2 = x509_get_basic_constraints(p,end_00,local_58,local_60);
              }
              if (uVar2 == 0) {
                bVar4 = false;
                uVar2 = (uint)crt;
              }
            }
          }
          else {
            *p = end_00;
            bVar4 = local_8c != 0;
            uVar2 = (uint)crt;
            if (bVar4) {
              uVar2 = 0xffffda9e;
            }
          }
        }
        else {
          uVar2 = iVar1 - 0x2500;
LAB_00125022:
          bVar4 = true;
        }
LAB_00125027:
        if (bVar4) {
          return uVar2;
        }
        puVar3 = *p;
        crt = (mbedtls_x509_crt *)(ulong)uVar2;
      } while (puVar3 < end);
    }
    iVar1 = -0x2566;
    if (puVar3 == end) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int x509_get_crt_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_crt *crt )
{
    int ret;
    size_t len;
    unsigned char *end_ext_data, *end_ext_octet;

    if( ( ret = mbedtls_x509_get_ext( p, end, &crt->v3_ext, 3 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    while( *p < end )
    {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        mbedtls_x509_buf extn_oid = {0, 0, NULL};
        int is_critical = 0; /* DEFAULT FALSE */
        int ext_type = 0;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_data = *p + len;

        /* Get extension ID */
        extn_oid.tag = **p;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &extn_oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        extn_oid.p = *p;
        *p += extn_oid.len;

        if( ( end - *p ) < 1 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_OUT_OF_DATA );

        /* Get optional critical */
        if( ( ret = mbedtls_asn1_get_bool( p, end_ext_data, &is_critical ) ) != 0 &&
            ( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        /* Data should be octet string type */
        if( ( ret = mbedtls_asn1_get_tag( p, end_ext_data, &len,
                MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        end_ext_octet = *p + len;

        if( end_ext_octet != end_ext_data )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

        /*
         * Detect supported extensions
         */
        ret = mbedtls_oid_get_x509_ext_type( &extn_oid, &ext_type );

        if( ret != 0 )
        {
            /* No parser found, skip extension */
            *p = end_ext_octet;

#if !defined(MBEDTLS_X509_ALLOW_UNSUPPORTED_CRITICAL_EXTENSION)
            if( is_critical )
            {
                /* Data is marked as critical: fail */
                return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
            }
#endif
            continue;
        }

        /* Forbid repeated extensions */
        if( ( crt->ext_types & ext_type ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS );

        crt->ext_types |= ext_type;

        switch( ext_type )
        {
        case MBEDTLS_X509_EXT_BASIC_CONSTRAINTS:
            /* Parse basic constraints */
            if( ( ret = x509_get_basic_constraints( p, end_ext_octet,
                    &crt->ca_istrue, &crt->max_pathlen ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_KEY_USAGE:
            /* Parse key usage */
            if( ( ret = x509_get_key_usage( p, end_ext_octet,
                    &crt->key_usage ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE:
            /* Parse extended key usage */
            if( ( ret = x509_get_ext_key_usage( p, end_ext_octet,
                    &crt->ext_key_usage ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_SUBJECT_ALT_NAME:
            /* Parse subject alt name */
            if( ( ret = x509_get_subject_alt_name( p, end_ext_octet,
                    &crt->subject_alt_names ) ) != 0 )
                return( ret );
            break;

        case MBEDTLS_X509_EXT_NS_CERT_TYPE:
            /* Parse netscape certificate type */
            if( ( ret = x509_get_ns_cert_type( p, end_ext_octet,
                    &crt->ns_cert_type ) ) != 0 )
                return( ret );
            break;

        default:
            return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE );
        }
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}